

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

Result<wallet::SelectionResult> *
wallet::coinselector_tests::select_coins
          (Result<wallet::SelectionResult> *__return_storage_ptr__,CAmount *target,
          CoinSelectionParams *cs_params,CCoinControl *cc,
          function<wallet::CoinsResult_(wallet::CWallet_&)> *coin_setup,NodeContext *m_node)

{
  _Base_ptr *pp_Var1;
  Result<wallet::SelectionResult> *pRVar2;
  size_t sVar3;
  T *pTVar4;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar5;
  undefined8 uVar6;
  CAmount *pCVar7;
  iterator pvVar8;
  iterator pvVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  ulong local_170;
  lazy_ostream local_168;
  undefined1 *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined1 *local_108;
  __uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> local_100;
  __uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> local_f8;
  char *local_f0;
  __uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> local_e8;
  assertion_result local_e0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  undefined1 local_b8 [8];
  __uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> _Stack_b0;
  __uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_> local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  pointer local_90;
  __uniq_ptr_impl<interfaces::Mining,_std::default_delete<interfaces::Mining>_> _Stack_88;
  CoinsResult available_coins;
  
  pRVar2 = *(Result<wallet::SelectionResult> **)(in_FS_OFFSET + 0x28);
  pp_Var1 = &available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  available_coins.coins._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&available_coins,"");
  NewWallet((NodeContext *)&wallet,
            (string *)
            (m_node->chain)._M_t.
            super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
            super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
            super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl);
  if ((_Base_ptr *)available_coins.coins._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)available_coins.coins._M_t._M_impl._0_8_,
                    (ulong)((long)&(available_coins.coins._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent)->_M_color + 1));
  }
  if ((coin_setup->super__Function_base)._M_manager == (_Manager_type)0x0) {
    if (*(Result<wallet::SelectionResult> **)(in_FS_OFFSET + 0x28) == pRVar2) {
      uVar6 = std::__throw_bad_function_call();
      boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
      ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)
                        __return_storage_ptr__);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock21.super_unique_lock);
      std::
      _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                   *)&available_coins);
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
      if (*(Result<wallet::SelectionResult> **)(in_FS_OFFSET + 0x28) == pRVar2) {
        _Unwind_Resume(uVar6);
      }
    }
  }
  else {
    (*coin_setup->_M_invoker)
              (&available_coins,(_Any_data *)coin_setup,
               (CWallet *)
               wallet._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl);
    criticalblock21.super_unique_lock._M_device =
         (mutex_type *)
         ((long)wallet._M_t.
                super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
                super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
                super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x1e8);
    criticalblock21.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock21.super_unique_lock);
    local_a0 = (_Base_ptr)&_Stack_b0;
    local_b8 = (undefined1  [8])0x0;
    _Stack_b0._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
         (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)
         (_Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>)0x0;
    local_a8._M_t.
    super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
    super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
         (tuple<interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)
         (_Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)0x0;
    local_90 = (pointer)0x0;
    _Stack_88._M_t.
    super__Tuple_impl<0UL,_interfaces::Mining_*,_std::default_delete<interfaces::Mining>_>.
    super__Head_base<0UL,_interfaces::Mining_*,_false>._M_head_impl =
         (tuple<interfaces::Mining_*,_std::default_delete<interfaces::Mining>_>)
         (_Tuple_impl<0UL,_interfaces::Mining_*,_std::default_delete<interfaces::Mining>_>)0x0;
    pCVar7 = target;
    local_98 = local_a0;
    SelectCoins(__return_storage_ptr__,
                (CWallet *)
                wallet._M_t.
                super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
                super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
                super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,&available_coins,
                (PreSelectedInputs *)local_b8,target,cc,cs_params);
    std::
    _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                 *)local_b8);
    if (*(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) ==
        '\x01') {
      pTVar4 = util::Result<wallet::SelectionResult>::value(__return_storage_ptr__);
      psVar5 = SelectionResult::GetInputSet(pTVar4);
      sVar3 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      local_138 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_130 = "";
      local_148 = &boost::unit_test::basic_cstring<char_const>::null;
      local_140 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x57e;
      file.m_begin = (iterator)&local_138;
      msg.m_end = (iterator)cc;
      msg.m_begin = (iterator)pCVar7;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg)
      ;
      local_168.m_empty = false;
      local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
      local_158 = boost::unit_test::lazy_ostream::inst;
      local_150 = "";
      local_170 = sVar3 * 0x110 + 0xb0;
      local_f8._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
      super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
           (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)&local_170;
      local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_170 < 0x61a81);
      local_e0.m_message.px = (element_type *)0x0;
      local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_e8._M_t.
      super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
      super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
           (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
           ((long)
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
           + 0x6b);
      local_a0 = (_Base_ptr)&local_f8;
      _Stack_b0._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
      super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
           (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)
           ((ulong)_Stack_b0._M_t.
                   super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                   super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl & 0xffffffffffffff00);
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013ae0c8;
      local_a8._M_t.
      super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
      super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
           (tuple<interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)
           boost::unit_test::lazy_ostream::inst;
      local_120._M_t.super___uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>._M_t.
      super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
      super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl =
           (__uniq_ptr_data<ECC_Context,_std::default_delete<ECC_Context>,_true,_true>)
           &MAX_STANDARD_TX_WEIGHT;
      local_110 = 0;
      local_118 = &PTR__lazy_ostream_013ae248;
      local_108 = boost::unit_test::lazy_ostream::inst;
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x5;
      local_100._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
      super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
           (tuple<CConnman_*,_std::default_delete<CConnman>_>)
           (tuple<CConnman_*,_std::default_delete<CConnman>_>)&local_120;
      boost::test_tools::tt_detail::report_assertion
                (&local_e0,&local_168,1,5,REQUIRE,0xf8816c,(size_t)&local_f0,0x57e,local_b8,
                 "MAX_STANDARD_TX_WEIGHT",&local_118);
      boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
      local_180 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_178 = "";
      local_190 = &boost::unit_test::basic_cstring<char_const>::null;
      local_188 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x580;
      file_00.m_begin = (iterator)&local_180;
      msg_00.m_end = pvVar9;
      msg_00.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
                 msg_00);
      local_168.m_empty = false;
      local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
      local_158 = boost::unit_test::lazy_ostream::inst;
      local_150 = "";
      pTVar4 = util::Result<wallet::SelectionResult>::value(__return_storage_ptr__);
      local_170 = SelectionResult::GetSelectedValue(pTVar4);
      local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*target <= (long)local_170);
      local_e0.m_message.px = (element_type *)0x0;
      local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_e8._M_t.
      super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
      super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
           (tuple<CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>)
           ((long)
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
           + 0x6b);
      local_f8._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
      super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
           (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)&local_170;
      _Stack_b0._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
      super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
           (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)
           ((ulong)_Stack_b0._M_t.
                   super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                   super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl & 0xffffffffffffff00);
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013ae428;
      local_a8._M_t.
      super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
      super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
           (tuple<interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)
           boost::unit_test::lazy_ostream::inst;
      local_a0 = (_Base_ptr)&local_f8;
      local_110 = 0;
      local_118 = &PTR__lazy_ostream_013ae428;
      local_108 = boost::unit_test::lazy_ostream::inst;
      local_120._M_t.super___uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>._M_t.
      super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
      super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl =
           (__uniq_ptr_data<ECC_Context,_std::default_delete<ECC_Context>,_true,_true>)
           (__uniq_ptr_data<ECC_Context,_std::default_delete<ECC_Context>,_true,_true>)target;
      local_100._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
      super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
           (tuple<CConnman_*,_std::default_delete<CConnman>_>)
           (tuple<CConnman_*,_std::default_delete<CConnman>_>)&local_120;
      boost::test_tools::tt_detail::report_assertion
                (&local_e0,&local_168,1,7,REQUIRE,0xf87928,(size_t)&local_f0,0x580,local_b8,"target"
                 ,&local_118);
      boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock21.super_unique_lock);
    std::
    _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                 *)&available_coins);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
    if (*(Result<wallet::SelectionResult> **)(in_FS_OFFSET + 0x28) == pRVar2) {
      return *(Result<wallet::SelectionResult> **)(in_FS_OFFSET + 0x28);
    }
  }
  __stack_chk_fail();
}

Assistant:

static util::Result<SelectionResult> select_coins(const CAmount& target, const CoinSelectionParams& cs_params, const CCoinControl& cc, std::function<CoinsResult(CWallet&)> coin_setup, const node::NodeContext& m_node)
{
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);
    auto available_coins = coin_setup(*wallet);

    LOCK(wallet->cs_wallet);
    auto result = SelectCoins(*wallet, available_coins, /*pre_set_inputs=*/ {}, target, cc, cs_params);
    if (result) {
        const auto signedTxSize = 10 + 34 + 68 * result->GetInputSet().size(); // static header size + output size + inputs size (P2WPKH)
        BOOST_CHECK_LE(signedTxSize * WITNESS_SCALE_FACTOR, MAX_STANDARD_TX_WEIGHT);

        BOOST_CHECK_GE(result->GetSelectedValue(), target);
    }
    return result;
}